

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::IntegerStateQueryTests::init
          (IntegerStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Context *pCVar3;
  bool bVar4;
  int iVar5;
  GetBooleanVerifier *pGVar6;
  undefined4 extraout_var;
  GetIntegerVerifier *pGVar7;
  undefined4 extraout_var_00;
  TestContext *pTVar8;
  undefined4 extraout_var_01;
  ApiCase *pAVar9;
  long *plVar10;
  char *pcVar11;
  ulong uVar12;
  TestNode *pTVar13;
  long *extraout_RAX;
  long *plVar14;
  undefined8 uVar15;
  bool bVar16;
  int _verifierNdx_38;
  int _verifierNdx_14;
  long lVar17;
  IntegerStateQueryTests *pIVar18;
  int _verifierNdx;
  long lVar19;
  int _verifierNdx_8;
  StateVerifier *normalVerifiers [3];
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  IntegerStateQueryTests *local_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  TestContext *local_a8;
  GetIntegerVerifier *local_a0;
  TestContext *local_98;
  TestContext *local_88;
  long *local_80 [2];
  long local_70 [2];
  TestContext *local_60;
  ApiCase *local_58;
  undefined8 uStack_50;
  char *local_48;
  ulong local_40;
  long local_38;
  
  pGVar6 = (GetBooleanVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar6->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar6->super_StateVerifier).m_testNamePostfix = "_getboolean";
  (pGVar6->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar6->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_00777e50;
  this->m_verifierBoolean = pGVar6;
  pGVar7 = (GetIntegerVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar7->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_00,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar7->super_StateVerifier).m_testNamePostfix = "_getinteger";
  (pGVar7->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar7->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_00777eb0;
  this->m_verifierInteger = pGVar7;
  pTVar8 = (TestContext *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&pTVar8->m_rootArchive,(Functions *)CONCAT44(extraout_var_01,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  pTVar8->m_watchDog = (qpWatchDog *)"_getfloat";
  *(undefined1 *)&pTVar8->m_cmdLine = 1;
  pTVar8->m_platform = (Platform *)&PTR__StateVerifier_00777f10;
  this->m_verifierFloat = (GetFloatVerifier *)pTVar8;
  local_a8 = (TestContext *)this->m_verifierBoolean;
  local_a0 = this->m_verifierInteger;
  pcVar11 = (char *)0x0;
  local_d0 = this;
  local_98 = pTVar8;
  local_88 = pTVar8;
  local_60 = local_a8;
  do {
    pTVar8 = local_60;
    bVar4 = true;
    local_48 = pcVar11;
    do {
      bVar16 = bVar4;
      pAVar9 = (ApiCase *)operator_new(0xa8);
      pCVar3 = (local_d0->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,(&PTR_anon_var_dwarf_5187f8_00777fa0)[(long)pcVar11 * 3],
                 (allocator<char> *)&local_c8);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_f0 = &local_e0;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_e0 = *plVar14;
        lStack_d8 = plVar10[3];
      }
      else {
        local_e0 = *plVar14;
        local_f0 = (long *)*plVar10;
      }
      local_e8 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_58 = (ApiCase *)(&DAT_00777fb0)[(long)pcVar11 * 3];
      uStack_50 = 0;
      ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,
                       (&PTR_anon_var_dwarf_572415_00777fa8)[(long)pcVar11 * 3]);
      (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00778258;
      pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)local_58
      ;
      pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar8;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      pTVar8 = local_88;
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      bVar4 = false;
    } while (bVar16);
    pcVar11 = local_48 + 1;
  } while (pcVar11 != (char *)0xb);
  bVar4 = true;
  do {
    bVar16 = bVar4;
    pAVar9 = (ApiCase *)operator_new(0xa0);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"sample_buffers","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"SAMPLE_BUFFERS");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_007782b0;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)local_60;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    pTVar8 = local_88;
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    local_60 = pTVar8;
    bVar4 = false;
  } while (bVar16);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa0);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"samples","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"SAMPLES");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778308;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"generate_mipmap_hint","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"GENERATE_MIPMAP_HINT");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778360;
    *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x8192;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar8;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa0);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"depth_func","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"DEPTH_FUNC");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_007783b8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa0);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"cull_face_mode","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"CULL_FACE_MODE");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778410;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa0);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"front_face_mode","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"FRONT_FACE");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778468;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa0);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"viewport","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"VIEWPORT");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_007784c0;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa0);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"scissor_box","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"SCISSOR_BOX");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778518;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa0);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"max_viewport_dims","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"MAX_VIEWPORT_DIMS");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778570;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa0);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"buffer_component_size","")
    ;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"x BITS");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_007785c8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"stencil_ref","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_REF");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778620;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xb97;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"stencil_back_ref","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_BACK_REF");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778620;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0x8ca3;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"stencil_ref_separate","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_REF (separate)");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778678;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40400000b97;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"stencil_ref_separate_both","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_REF (separate)");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778678;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800000b97;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"stencil_back_ref_separate","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_BACK_REF (separate)");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778678;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40500008ca3;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"stencil_back_ref_separate_both","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_BACK_REF (separate)");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778678;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800008ca3;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    local_88 = (TestContext *)(&DAT_007780b0 + lVar19 * 5);
    lVar17 = 0;
    local_38 = lVar19;
    do {
      pTVar8 = (&local_a8)[lVar17];
      pAVar9 = (ApiCase *)operator_new(0xa8);
      pCVar3 = (local_d0->super_TestCaseGroup).m_context;
      local_c8 = &local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"stencil_","");
      local_58 = *(ApiCase **)local_88;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_110 = &local_100;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_100 = *plVar14;
        lStack_f8 = plVar10[3];
      }
      else {
        local_100 = *plVar14;
        local_110 = (long *)*plVar10;
      }
      local_108 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_f0 = &local_e0;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_e0 = *plVar14;
        lStack_d8 = plVar10[3];
      }
      else {
        local_e0 = *plVar14;
        local_f0 = (long *)*plVar10;
      }
      local_e8 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_60 = *(TestContext **)((long)local_88 + 8);
      uVar1 = *(undefined4 *)((long)local_88 + 0x10);
      ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,(char *)local_60);
      (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_007786d0;
      pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
      *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_40 = CONCAT44(local_40._4_4_,uVar1);
    lVar19 = 0;
    pIVar18 = local_d0;
    do {
      pTVar8 = (&local_a8)[lVar19];
      pAVar9 = (ApiCase *)operator_new(0xa8);
      pCVar3 = (pIVar18->super_TestCaseGroup).m_context;
      local_c8 = &local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"stencil_back_","");
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_110 = &local_100;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_100 = *plVar14;
        lStack_f8 = plVar10[3];
      }
      else {
        local_100 = *plVar14;
        local_110 = (long *)*plVar10;
      }
      local_108 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_f0 = &local_e0;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_e0 = *plVar14;
        lStack_d8 = plVar10[3];
      }
      else {
        local_e0 = *plVar14;
        local_f0 = (long *)*plVar10;
      }
      local_e8 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_48 = *(char **)((long)local_88 + 0x18);
      uVar1 = *(undefined4 *)((long)local_88 + 0x20);
      ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,local_48);
      pIVar18 = local_d0;
      (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_007786d0;
      pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
      *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    local_88 = (TestContext *)CONCAT44(local_88._4_4_,uVar1);
    lVar19 = 0;
    do {
      pTVar8 = (&local_a8)[lVar19];
      pAVar9 = (ApiCase *)operator_new(0xa8);
      pCVar3 = (pIVar18->super_TestCaseGroup).m_context;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"stencil_","");
      plVar10 = (long *)std::__cxx11::string::append((char *)local_80);
      local_c8 = &local_b8;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_b8 = *plVar14;
        lStack_b0 = plVar10[3];
      }
      else {
        local_b8 = *plVar14;
        local_c8 = (long *)*plVar10;
      }
      local_c0 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_110 = &local_100;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_100 = *plVar14;
        lStack_f8 = plVar10[3];
      }
      else {
        local_100 = *plVar14;
        local_110 = (long *)*plVar10;
      }
      local_108 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_f0 = &local_e0;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_e0 = *plVar14;
        lStack_d8 = plVar10[3];
      }
      else {
        local_e0 = *plVar14;
        local_f0 = (long *)*plVar10;
      }
      local_e8 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,(char *)local_60);
      pIVar18 = local_d0;
      pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
      *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
           (undefined4)local_40;
      (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00778730;
      *(undefined4 *)((long)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           0x408;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    lVar19 = 0;
    do {
      pTVar8 = (&local_a8)[lVar19];
      pAVar9 = (ApiCase *)operator_new(0xa8);
      pCVar3 = (pIVar18->super_TestCaseGroup).m_context;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"stencil_back_","");
      plVar10 = (long *)std::__cxx11::string::append((char *)local_80);
      local_c8 = &local_b8;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_b8 = *plVar14;
        lStack_b0 = plVar10[3];
      }
      else {
        local_b8 = *plVar14;
        local_c8 = (long *)*plVar10;
      }
      local_c0 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_110 = &local_100;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_100 = *plVar14;
        lStack_f8 = plVar10[3];
      }
      else {
        local_100 = *plVar14;
        local_110 = (long *)*plVar10;
      }
      local_108 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_f0 = &local_e0;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_e0 = *plVar14;
        lStack_d8 = plVar10[3];
      }
      else {
        local_e0 = *plVar14;
        local_f0 = (long *)*plVar10;
      }
      local_e8 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,local_48);
      pIVar18 = local_d0;
      pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
      *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
           local_88._0_4_;
      (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00778730;
      *(undefined4 *)((long)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           0x408;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    lVar19 = 0;
    do {
      pTVar8 = (&local_a8)[lVar19];
      pAVar9 = (ApiCase *)operator_new(0xa8);
      pCVar3 = (pIVar18->super_TestCaseGroup).m_context;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"stencil_","");
      plVar10 = (long *)std::__cxx11::string::append((char *)local_80);
      local_c8 = &local_b8;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_b8 = *plVar14;
        lStack_b0 = plVar10[3];
      }
      else {
        local_b8 = *plVar14;
        local_c8 = (long *)*plVar10;
      }
      local_c0 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_110 = &local_100;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_100 = *plVar14;
        lStack_f8 = plVar10[3];
      }
      else {
        local_100 = *plVar14;
        local_110 = (long *)*plVar10;
      }
      local_108 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_f0 = &local_e0;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_e0 = *plVar14;
        lStack_d8 = plVar10[3];
      }
      else {
        local_e0 = *plVar14;
        local_f0 = (long *)*plVar10;
      }
      local_e8 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,(char *)local_60);
      pIVar18 = local_d0;
      pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
      *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
           (undefined4)local_40;
      (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00778730;
      *(undefined4 *)((long)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           0x404;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    lVar19 = 0;
    do {
      pTVar8 = (&local_a8)[lVar19];
      pAVar9 = (ApiCase *)operator_new(0xa8);
      pCVar3 = (pIVar18->super_TestCaseGroup).m_context;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"stencil_back_","");
      plVar10 = (long *)std::__cxx11::string::append((char *)local_80);
      local_c8 = &local_b8;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_b8 = *plVar14;
        lStack_b0 = plVar10[3];
      }
      else {
        local_b8 = *plVar14;
        local_c8 = (long *)*plVar10;
      }
      local_c0 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_110 = &local_100;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_100 = *plVar14;
        lStack_f8 = plVar10[3];
      }
      else {
        local_100 = *plVar14;
        local_110 = (long *)*plVar10;
      }
      local_108 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_f0 = &local_e0;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_e0 = *plVar14;
        lStack_d8 = plVar10[3];
      }
      else {
        local_e0 = *plVar14;
        local_f0 = (long *)*plVar10;
      }
      local_e8 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,local_48);
      pIVar18 = local_d0;
      pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
      *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
           local_88._0_4_;
      (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00778730;
      *(undefined4 *)((long)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           0x405;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    lVar19 = local_38 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa0);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"stencil_func","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_FUNC");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778790;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"stencil_func_separate","")
    ;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_FUNC (separate)");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_007787e8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40400000b92;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"stencil_func_separate_both","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_FUNC (separate)");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_007787e8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800000b92;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"stencil_back_func_separate","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_FUNC (separate)");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_007787e8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40500008800;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"stencil_back_func_separate_both","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_FUNC (separate)");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_007787e8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800008800;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"stencil_value_mask","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_VALUE_MASK");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778840;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xb93;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"stencil_back_value_mask","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_BACK_VALUE_MASK");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778840;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0x8ca4;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"stencil_value_mask_separate","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_VALUE_MASK (separate)");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778898;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40400000b93;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"stencil_value_mask_separate_both","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_VALUE_MASK (separate)");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778898;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800000b93;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"stencil_back_value_mask_separate","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_BACK_VALUE_MASK (separate)");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778898;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40500008ca4;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"stencil_back_value_mask_separate_both","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_BACK_VALUE_MASK (separate)");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778898;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800008ca4;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"stencil_writemask","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_WRITEMASK");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_007788f0;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xb98;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"stencil_back_writemask","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_BACK_WRITEMASK");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_007788f0;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0x8ca5;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"stencil_writemask_separate","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_WRITEMASK (separate)");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778948;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40400000b98;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"stencil_writemask_separate_both","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_WRITEMASK (separate)");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778948;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800000b98;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"stencil_back_writemask_separate","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_BACK_WRITEMASK (separate)");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778948;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40500008ca5;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"stencil_back_writemask_separate_both","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_BACK_WRITEMASK (separate)");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778948;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800008ca5;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"unpack_alignment","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"UNPACK_ALIGNMENT");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_007789a0;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xcf5;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa8);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"pack_alignment","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"PACK_ALIGNMENT");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_007789a0;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xd05;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  uVar12 = 0;
  do {
    lVar19 = 0;
    local_40 = uVar12;
    do {
      pTVar8 = (&local_a8)[lVar19];
      local_58 = (ApiCase *)operator_new(0xa8);
      pCVar3 = (local_d0->super_TestCaseGroup).m_context;
      local_60 = (TestContext *)(&PTR_anon_var_dwarf_572986_00778130)[uVar12 * 3];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,(char *)local_60,(allocator<char> *)&local_c8);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
      pAVar9 = local_58;
      local_f0 = &local_e0;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_e0 = *plVar14;
        lStack_d8 = plVar10[3];
      }
      else {
        local_e0 = *plVar14;
        local_f0 = (long *)*plVar10;
      }
      local_e8 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_48 = (char *)(&DAT_00778138)[uVar12 * 3];
      uVar1 = (&DAT_00778140)[uVar12 * 6];
      uVar2 = (&DAT_00778144)[uVar12 * 6];
      local_88 = pTVar8;
      ApiCase::ApiCase(local_58,pCVar3,(char *)local_f0,local_48);
      (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_007789f8;
      pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)local_88
      ;
      *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      *(undefined4 *)((long)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           uVar2;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
      local_58 = (ApiCase *)CONCAT44(local_58._4_4_,uVar2);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    lVar19 = 0;
    do {
      pTVar8 = (&local_a8)[lVar19];
      pAVar9 = (ApiCase *)operator_new(0xa8);
      pCVar3 = (local_d0->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,(char *)local_60,(allocator<char> *)local_80);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_110 = &local_100;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_100 = *plVar14;
        lStack_f8 = plVar10[3];
      }
      else {
        local_100 = *plVar14;
        local_110 = (long *)*plVar10;
      }
      local_108 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_f0 = &local_e0;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_e0 = *plVar14;
        lStack_d8 = plVar10[3];
      }
      else {
        local_e0 = *plVar14;
        local_f0 = (long *)*plVar10;
      }
      local_e8 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      pcVar11 = local_48;
      ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,local_48);
      pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
      *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      *(undefined4 *)((long)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           local_58._0_4_;
      (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00778a58;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    uVar12 = local_40 + 1;
  } while (uVar12 != 4);
  uVar15 = CONCAT71((int7)((ulong)pcVar11 >> 8),1);
  lVar19 = 0;
  do {
    local_40 = CONCAT44(local_40._4_4_,(int)uVar15);
    lVar17 = 0;
    do {
      pTVar8 = (&local_a8)[lVar17];
      local_58 = (ApiCase *)operator_new(0xa8);
      pCVar3 = (local_d0->super_TestCaseGroup).m_context;
      local_60 = (TestContext *)(&PTR_anon_var_dwarf_5729df_00778190)[lVar19 * 3];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,(char *)local_60,(allocator<char> *)&local_c8);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
      pAVar9 = local_58;
      local_f0 = &local_e0;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_e0 = *plVar14;
        lStack_d8 = plVar10[3];
      }
      else {
        local_e0 = *plVar14;
        local_f0 = (long *)*plVar10;
      }
      local_e8 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_48 = (char *)(&DAT_00778198)[lVar19 * 3];
      uVar1 = (&DAT_007781a0)[lVar19 * 6];
      uVar2 = (&DAT_007781a4)[lVar19 * 6];
      local_88 = pTVar8;
      ApiCase::ApiCase(local_58,pCVar3,(char *)local_f0,local_48);
      (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00778ab8;
      pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)local_88
      ;
      *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      *(undefined4 *)((long)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           uVar2;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
      local_58 = (ApiCase *)CONCAT44(local_58._4_4_,uVar2);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    lVar19 = 0;
    do {
      pTVar8 = (&local_a8)[lVar19];
      pAVar9 = (ApiCase *)operator_new(0xa8);
      pCVar3 = (local_d0->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,(char *)local_60,(allocator<char> *)local_80);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_110 = &local_100;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_100 = *plVar14;
        lStack_f8 = plVar10[3];
      }
      else {
        local_100 = *plVar14;
        local_110 = (long *)*plVar10;
      }
      local_108 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_f0 = &local_e0;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_e0 = *plVar14;
        lStack_d8 = plVar10[3];
      }
      else {
        local_e0 = *plVar14;
        local_f0 = (long *)*plVar10;
      }
      local_e8 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,local_48);
      pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
      *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      *(undefined4 *)((long)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           local_58._0_4_;
      (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00778b18;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    lVar19 = 1;
    uVar15 = 0;
  } while ((local_40 & 1) != 0);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xb0);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"compressed_texture_formats","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"COMPRESSED_TEXTURE_FORMATS");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778b78;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x86a2000086a3
    ;
    *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
         0;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xb0);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"shader_binary_formats","")
    ;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"SHADER_BINARY_FORMATS");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778b78;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x8df900008df8
    ;
    *(undefined4 *)&pAVar9[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
         0;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar19);
    pTVar13 = (TestNode *)operator_new(0x88);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"array_buffer_binding","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar13,pCVar3->m_testCtx,(char *)local_f0,"ARRAY_BUFFER_BINDING");
    pTVar13[1]._vptr_TestNode = (_func_int **)pCVar3;
    *(undefined4 *)&pTVar13[1].m_testCtx = uVar1;
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_00778bd0;
    *(undefined8 *)((long)&pTVar13[1].m_testCtx + 4) = 0x889200008894;
    tcu::TestNode::addChild((TestNode *)local_d0,pTVar13);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0xc);
  lVar19 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar19);
    pTVar13 = (TestNode *)operator_new(0x88);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"element_array_buffer_binding","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar13,pCVar3->m_testCtx,(char *)local_f0,"ELEMENT_ARRAY_BUFFER_BINDING"
              );
    pTVar13[1]._vptr_TestNode = (_func_int **)pCVar3;
    *(undefined4 *)&pTVar13[1].m_testCtx = uVar1;
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_00778bd0;
    *(undefined8 *)((long)&pTVar13[1].m_testCtx + 4) = 0x889300008895;
    tcu::TestNode::addChild((TestNode *)local_d0,pTVar13);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0xc);
  lVar19 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar19);
    pTVar13 = (TestNode *)operator_new(0x80);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"current_program_binding","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar13,pCVar3->m_testCtx,(char *)local_f0,"CURRENT_PROGRAM");
    pTVar13[1]._vptr_TestNode = (_func_int **)pCVar3;
    *(undefined4 *)&pTVar13[1].m_testCtx = uVar1;
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_00778c40;
    tcu::TestNode::addChild((TestNode *)local_d0,pTVar13);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0xc);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa0);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"stencil_clear_value","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"STENCIL_CLEAR_VALUE");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778c98;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa0);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"active_texture","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,"ACTIVE_TEXTURE");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778cf0;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  lVar19 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar19);
    pTVar13 = (TestNode *)operator_new(0x80);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"renderbuffer_binding","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar13,pCVar3->m_testCtx,(char *)local_f0,"RENDERBUFFER_BINDING");
    pTVar13[1]._vptr_TestNode = (_func_int **)pCVar3;
    *(undefined4 *)&pTVar13[1].m_testCtx = uVar1;
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_00778d48;
    tcu::TestNode::addChild((TestNode *)local_d0,pTVar13);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0xc);
  lVar19 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar19);
    pTVar13 = (TestNode *)operator_new(0x88);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"texture_binding_2d","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar13,pCVar3->m_testCtx,(char *)local_f0,"TEXTURE_BINDING_2D");
    pTVar13[1]._vptr_TestNode = (_func_int **)pCVar3;
    *(undefined4 *)&pTVar13[1].m_testCtx = uVar1;
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_00778da0;
    *(undefined8 *)((long)&pTVar13[1].m_testCtx + 4) = 0xde100008069;
    tcu::TestNode::addChild((TestNode *)local_d0,pTVar13);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0xc);
  lVar19 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar19);
    pTVar13 = (TestNode *)operator_new(0x88);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"texture_binding_cube_map","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar13,pCVar3->m_testCtx,(char *)local_f0,"TEXTURE_BINDING_CUBE_MAP");
    pTVar13[1]._vptr_TestNode = (_func_int **)pCVar3;
    *(undefined4 *)&pTVar13[1].m_testCtx = uVar1;
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_00778da0;
    *(undefined8 *)((long)&pTVar13[1].m_testCtx + 4) = 0x851300008514;
    tcu::TestNode::addChild((TestNode *)local_d0,pTVar13);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0xc);
  lVar19 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar19);
    pTVar13 = (TestNode *)operator_new(0x80);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"framebuffer_binding","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar13,pCVar3->m_testCtx,(char *)local_f0,
               "DRAW_FRAMEBUFFER_BINDING and READ_FRAMEBUFFER_BINDING");
    pTVar13[1]._vptr_TestNode = (_func_int **)pCVar3;
    *(undefined4 *)&pTVar13[1].m_testCtx = uVar1;
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_00778df8;
    tcu::TestNode::addChild((TestNode *)local_d0,pTVar13);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0xc);
  lVar19 = 0;
  do {
    pTVar8 = (&local_a8)[lVar19];
    pAVar9 = (ApiCase *)operator_new(0xa0);
    pCVar3 = (local_d0->super_TestCaseGroup).m_context;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"implementation_color_read","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar10[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar10;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar9,pCVar3,(char *)local_f0,
                     "IMPLEMENTATION_COLOR_READ_TYPE and IMPLEMENTATION_COLOR_READ_FORMAT");
    (pAVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00778e50;
    pAVar9[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar8;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar9);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    plVar10 = &local_100;
    if (local_110 != plVar10) {
      operator_delete(local_110,local_100 + 1);
      plVar10 = extraout_RAX;
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  return (int)plVar10;
}

Assistant:

void IntegerStateQueryTests::init (void)
{
	static const QueryType queryTypes[] =
	{
		QUERY_BOOLEAN,
		QUERY_INTEGER,
		QUERY_FLOAT,
	};

	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	const struct LimitedStateInteger
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		GLint			value;
	} implementationMinLimits[] =
	{
		{ "subpixel_bits",						"SUBPIXEL_BITS has  a minimum value of 4",						GL_SUBPIXEL_BITS,						4	},
		{ "max_texture_size",					"MAX_TEXTURE_SIZE has  a minimum value of 64",					GL_MAX_TEXTURE_SIZE,					64	},
		{ "max_cube_map_texture_size",			"MAX_CUBE_MAP_TEXTURE_SIZE has  a minimum value of 16",			GL_MAX_CUBE_MAP_TEXTURE_SIZE,			16	},
		{ "max_vertex_attribs",					"MAX_VERTEX_ATTRIBS has  a minimum value of 8",					GL_MAX_VERTEX_ATTRIBS,					8	},
		{ "max_vertex_uniform_vectors",			"MAX_VERTEX_UNIFORM_VECTORS has  a minimum value of 128",		GL_MAX_VERTEX_UNIFORM_VECTORS,			128	},
		{ "max_varying_vectors",				"MAX_VARYING_VECTORS has  a minimum value of 8",				GL_MAX_VARYING_VECTORS,					8	},
		{ "max_combined_texture_image_units",	"MAX_COMBINED_TEXTURE_IMAGE_UNITS has  a minimum value of 8",	GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,	8	},
		{ "max_vertex_texture_image_units",		"MAX_VERTEX_TEXTURE_IMAGE_UNITS has  a minimum value of 0",		GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS,		0	},
		{ "max_texture_image_units",			"MAX_TEXTURE_IMAGE_UNITS has  a minimum value of 8",			GL_MAX_TEXTURE_IMAGE_UNITS,				8	},
		{ "max_fragment_uniform_vectors",		"MAX_FRAGMENT_UNIFORM_VECTORS has  a minimum value of 16",		GL_MAX_FRAGMENT_UNIFORM_VECTORS,		16	},
		{ "max_renderbuffer_size",				"MAX_RENDERBUFFER_SIZE has  a minimum value of 1",				GL_MAX_RENDERBUFFER_SIZE,				1	},
	};

	// \note implementation defined limits have their own tests so just check the conversions to boolean and float
	StateVerifier* implementationLimitVerifiers[]	= {m_verifierBoolean,						m_verifierFloat};
	StateVerifier* normalVerifiers[]				= {m_verifierBoolean,	m_verifierInteger,	m_verifierFloat};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationMinLimits); testNdx++)
		FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new ConstantMinimumValueTestCase(m_context, verifier, (std::string(implementationMinLimits[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationMinLimits[testNdx].description, implementationMinLimits[testNdx].targetName, implementationMinLimits[testNdx].value)));

	FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new SampleBuffersTestCase		(m_context,	 verifier, (std::string("sample_buffers")						+ verifier->getTestNamePostfix()).c_str(),		"SAMPLE_BUFFERS")));

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new SamplesTestCase				(m_context,	 verifier, (std::string("samples")								+ verifier->getTestNamePostfix()).c_str(),		"SAMPLES")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new HintTestCase				(m_context,	 verifier, (std::string("generate_mipmap_hint")					+ verifier->getTestNamePostfix()).c_str(),		"GENERATE_MIPMAP_HINT",				GL_GENERATE_MIPMAP_HINT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DepthFuncTestCase			(m_context,	 verifier, (std::string("depth_func")							+ verifier->getTestNamePostfix()).c_str(),		"DEPTH_FUNC")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new CullFaceTestCase			(m_context,	 verifier, (std::string("cull_face_mode")						+ verifier->getTestNamePostfix()).c_str(),		"CULL_FACE_MODE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new FrontFaceTestCase			(m_context,	 verifier, (std::string("front_face_mode")						+ verifier->getTestNamePostfix()).c_str(),		"FRONT_FACE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ViewPortTestCase			(m_context,	 verifier, (std::string("viewport")								+ verifier->getTestNamePostfix()).c_str(),		"VIEWPORT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ScissorBoxTestCase			(m_context,	 verifier, (std::string("scissor_box")							+ verifier->getTestNamePostfix()).c_str(),		"SCISSOR_BOX")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new MaxViewportDimsTestCase		(m_context,	 verifier, (std::string("max_viewport_dims")					+ verifier->getTestNamePostfix()).c_str(),		"MAX_VIEWPORT_DIMS")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new BufferComponentSizeCase		(m_context,	 verifier, (std::string("buffer_component_size")				+ verifier->getTestNamePostfix()).c_str(),		"x BITS")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefTestCase			(m_context,	 verifier, (std::string("stencil_ref")							+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF",						GL_STENCIL_REF)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefTestCase			(m_context,	 verifier, (std::string("stencil_back_ref")						+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF",					GL_STENCIL_BACK_REF)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_ref_separate")					+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF (separate)",			GL_STENCIL_REF,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_ref_separate_both")			+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF (separate)",			GL_STENCIL_REF,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_back_ref_separate")			+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF (separate)",		GL_STENCIL_BACK_REF,	GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_back_ref_separate_both")		+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF (separate)",		GL_STENCIL_BACK_REF,	GL_FRONT_AND_BACK)));

	const struct NamedStencilOp
	{
		const char*		name;

		const char*		frontDescription;
		GLenum			frontTarget;
		const char*		backDescription;
		GLenum			backTarget;
	} stencilOps[] =
	{
		{ "fail",		"STENCIL_FAIL",				GL_STENCIL_FAIL,			"STENCIL_BACK_FAIL",			GL_STENCIL_BACK_FAIL			},
		{ "depth_fail",	"STENCIL_PASS_DEPTH_FAIL",	GL_STENCIL_PASS_DEPTH_FAIL,	"STENCIL_BACK_PASS_DEPTH_FAIL",	GL_STENCIL_BACK_PASS_DEPTH_FAIL	},
		{ "depth_pass",	"STENCIL_PASS_DEPTH_PASS",	GL_STENCIL_PASS_DEPTH_PASS,	"STENCIL_BACK_PASS_DEPTH_PASS",	GL_STENCIL_BACK_PASS_DEPTH_PASS	}
	};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(stencilOps); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpTestCase			(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpTestCase			(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,	stencilOps[testNdx].backTarget)));

		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + "_separate_both"	+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget,	GL_FRONT_AND_BACK)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + "_separate_both"	+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,		stencilOps[testNdx].backTarget,		GL_FRONT_AND_BACK)));

		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + "_separate"		+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget,	GL_FRONT)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + "_separate"		+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,		stencilOps[testNdx].backTarget,		GL_BACK)));
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncTestCase					(m_context, verifier,	(std::string("stencil_func")								+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_func_separate")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_FUNC,				GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_func_separate_both")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_FUNC,				GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_func_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_BACK_FUNC,			GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_func_separate_both")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_BACK_FUNC,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskTestCase					(m_context, verifier,	(std::string("stencil_value_mask")							+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK",					GL_STENCIL_VALUE_MASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskTestCase					(m_context, verifier,	(std::string("stencil_back_value_mask")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK",				GL_STENCIL_BACK_VALUE_MASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_value_mask_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK (separate)",		GL_STENCIL_VALUE_MASK,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_value_mask_separate_both")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK (separate)",		GL_STENCIL_VALUE_MASK,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_value_mask_separate")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK (separate)",	GL_STENCIL_BACK_VALUE_MASK,		GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_value_mask_separate_both")		+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK (separate)",	GL_STENCIL_BACK_VALUE_MASK,		GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskTestCase			(m_context, verifier,	(std::string("stencil_writemask")							+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK",					GL_STENCIL_WRITEMASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskTestCase			(m_context, verifier,	(std::string("stencil_back_writemask")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK",				GL_STENCIL_BACK_WRITEMASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_writemask_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK (separate)",			GL_STENCIL_WRITEMASK,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_writemask_separate_both")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK (separate)",			GL_STENCIL_WRITEMASK,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_back_writemask_separate")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK (separate)",	GL_STENCIL_BACK_WRITEMASK,		GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_back_writemask_separate_both")		+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK (separate)",	GL_STENCIL_BACK_WRITEMASK,		GL_FRONT_AND_BACK)));

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreAlignTestCase(m_context, verifier, (std::string("unpack_alignment")	+ verifier->getTestNamePostfix()).c_str(),	"UNPACK_ALIGNMENT",	GL_UNPACK_ALIGNMENT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreAlignTestCase(m_context, verifier, (std::string("pack_alignment")		+ verifier->getTestNamePostfix()).c_str(),	"PACK_ALIGNMENT",	GL_PACK_ALIGNMENT)));

	{
		const struct BlendColorState
		{
			const char*	name;
			const char*	description;
			GLenum		target;
			int			initialValue;
		} blendColorStates[] =
		{
			{ "blend_src_rgb",		"BLEND_SRC_RGB",	GL_BLEND_SRC_RGB,		GL_ONE	},
			{ "blend_src_alpha",	"BLEND_SRC_ALPHA",	GL_BLEND_SRC_ALPHA,		GL_ONE	},
			{ "blend_dst_rgb",		"BLEND_DST_RGB",	GL_BLEND_DST_RGB,		GL_ZERO	},
			{ "blend_dst_alpha",	"BLEND_DST_ALPHA",	GL_BLEND_DST_ALPHA,		GL_ZERO	}
		};
		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(blendColorStates); testNdx++)
		{
			FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendFuncTestCase			(m_context, verifier, (std::string(blendColorStates[testNdx].name)					+ verifier->getTestNamePostfix()).c_str(),	blendColorStates[testNdx].description,	blendColorStates[testNdx].target,	blendColorStates[testNdx].initialValue)));
			FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendFuncSeparateTestCase	(m_context, verifier, (std::string(blendColorStates[testNdx].name) + "_separate"	+ verifier->getTestNamePostfix()).c_str(),	blendColorStates[testNdx].description,	blendColorStates[testNdx].target,	blendColorStates[testNdx].initialValue)));
		}
	}

	{
		const struct BlendEquationState
		{
			const char*	name;
			const char*	description;
			GLenum		target;
			int			initialValue;
		} blendEquationStates[] =
		{
			{ "blend_equation_rgb",		"BLEND_EQUATION_RGB",	GL_BLEND_EQUATION_RGB,		GL_FUNC_ADD	},
			{ "blend_equation_alpha",	"BLEND_EQUATION_ALPHA",	GL_BLEND_EQUATION_ALPHA,	GL_FUNC_ADD	}
		};
		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(blendEquationStates); testNdx++)
		{
			FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendEquationTestCase			(m_context, verifier, (std::string(blendEquationStates[testNdx].name) +				+ verifier->getTestNamePostfix()).c_str(),		blendEquationStates[testNdx].description,	blendEquationStates[testNdx].target,	blendEquationStates[testNdx].initialValue)));
			FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendEquationSeparateTestCase	(m_context, verifier, (std::string(blendEquationStates[testNdx].name) + "_separate"	+ verifier->getTestNamePostfix()).c_str(),		blendEquationStates[testNdx].description,	blendEquationStates[testNdx].target,	blendEquationStates[testNdx].initialValue)));
		}
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationArrayTestCase			(m_context, verifier, (std::string("compressed_texture_formats")	+ verifier->getTestNamePostfix()).c_str(),	"COMPRESSED_TEXTURE_FORMATS",	GL_COMPRESSED_TEXTURE_FORMATS,		GL_NUM_COMPRESSED_TEXTURE_FORMATS,	0)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationArrayTestCase			(m_context, verifier, (std::string("shader_binary_formats")			+ verifier->getTestNamePostfix()).c_str(),	"SHADER_BINARY_FORMATS",		GL_SHADER_BINARY_FORMATS,			GL_NUM_SHADER_BINARY_FORMATS,		0)));

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new BufferBindingTestCase				(m_context, queryType, (std::string("array_buffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"ARRAY_BUFFER_BINDING",			GL_ARRAY_BUFFER_BINDING,			GL_ARRAY_BUFFER)));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new BufferBindingTestCase				(m_context, queryType, (std::string("element_array_buffer_binding")	+ getQueryTypeSuffix(queryType)).c_str(),	"ELEMENT_ARRAY_BUFFER_BINDING",	GL_ELEMENT_ARRAY_BUFFER_BINDING,	GL_ELEMENT_ARRAY_BUFFER)));

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new CurrentProgramBindingTestCase		(m_context, queryType, (std::string("current_program_binding")		+ getQueryTypeSuffix(queryType)).c_str(),	"CURRENT_PROGRAM")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilClearValueTestCase			(m_context, verifier, (std::string("stencil_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ActiveTextureTestCase				(m_context, verifier, (std::string("active_texture")				+ verifier->getTestNamePostfix()).c_str(),	"ACTIVE_TEXTURE")));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new RenderbufferBindingTestCase			(m_context, queryType, (std::string("renderbuffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"RENDERBUFFER_BINDING")));

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new TextureBindingTestCase				(m_context, queryType, (std::string("texture_binding_2d")			+ getQueryTypeSuffix(queryType)).c_str(),	"TEXTURE_BINDING_2D",			GL_TEXTURE_BINDING_2D,			GL_TEXTURE_2D)));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new TextureBindingTestCase				(m_context, queryType, (std::string("texture_binding_cube_map")		+ getQueryTypeSuffix(queryType)).c_str(),	"TEXTURE_BINDING_CUBE_MAP",		GL_TEXTURE_BINDING_CUBE_MAP,	GL_TEXTURE_CUBE_MAP)));

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new FrameBufferBindingTestCase			(m_context, queryType, (std::string("framebuffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"DRAW_FRAMEBUFFER_BINDING and READ_FRAMEBUFFER_BINDING")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationColorReadTestCase		(m_context, verifier, (std::string("implementation_color_read")		+ verifier->getTestNamePostfix()).c_str(),	"IMPLEMENTATION_COLOR_READ_TYPE and IMPLEMENTATION_COLOR_READ_FORMAT")));
}